

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall
TPZMatrix<double>::AddKel
          (TPZMatrix<double> *this,TPZFMatrix<double> *elmat,TPZVec<long> *destinationindex)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  double *pdVar5;
  long lVar6;
  long lVar7;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double prevval;
  double local_50;
  TPZVec<long> *local_48;
  long local_40;
  TPZFMatrix<double> *local_38;
  
  lVar1 = (elmat->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  local_48 = destinationindex;
  local_38 = elmat;
  iVar4 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x10])();
  local_40 = 0;
  if (0 < lVar1) {
    local_40 = lVar1;
  }
  if (iVar4 == 0) {
    for (lVar7 = 0; lVar7 != local_40; lVar7 = lVar7 + 1) {
      lVar2 = local_48->fStore[lVar7];
      for (lVar6 = 0; lVar1 != lVar6; lVar6 = lVar6 + 1) {
        lVar3 = local_48->fStore[lVar6];
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar2,lVar3);
        local_50 = extraout_XMM0_Qa_00;
        pdVar5 = TPZFMatrix<double>::operator()(local_38,lVar7,lVar6);
        local_50 = *pdVar5 + local_50;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar2,lVar3,&local_50);
      }
    }
  }
  else {
    for (lVar7 = 0; lVar7 != local_40; lVar7 = lVar7 + 1) {
      lVar2 = local_48->fStore[lVar7];
      for (lVar6 = lVar7; lVar1 != lVar6; lVar6 = lVar6 + 1) {
        lVar3 = local_48->fStore[lVar6];
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar2,lVar3);
        local_50 = extraout_XMM0_Qa;
        pdVar5 = TPZFMatrix<double>::operator()(local_38,lVar7,lVar6);
        local_50 = *pdVar5 + local_50;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar2,lVar3,&local_50);
      }
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::AddKel(TPZFMatrix<TVar> &elmat, TPZVec<int64_t> &destinationindex) {
	
	int64_t nelem = elmat.Rows();
  	int64_t icoef,jcoef,ieq,jeq;
	if(IsSymmetric()) {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			for(jcoef=icoef; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				TVar prevval = GetVal(ieq,jeq);
				prevval += elmat(icoef,jcoef);
				PutVal(ieq,jeq,prevval);
			}
		}
	} else {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			for(jcoef=0; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				TVar prevval = GetVal(ieq,jeq);
				prevval += elmat(icoef,jcoef);
				PutVal(ieq,jeq,prevval);
			}
		}
	}
}